

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.c
# Opt level: O2

float noise_pink(noise_segment_data *data)

{
  uint uVar1;
  long lVar2;
  int64_t *piVar3;
  float fVar4;
  
  uVar1 = data->pink_index + 1U & data->pink_index_mask;
  data->pink_index = uVar1;
  if (uVar1 != 0) {
    piVar3 = data->pink_rows;
    for (; (uVar1 & 1) == 0; uVar1 = (int)uVar1 >> 1) {
      piVar3 = piVar3 + 1;
    }
    data->pink_running_sum = data->pink_running_sum - *piVar3;
    fVar4 = mixed_random();
    lVar2 = (long)((fVar4 + -0.5) * 67108864.0);
    data->pink_running_sum = data->pink_running_sum + lVar2;
    *piVar3 = lVar2;
  }
  fVar4 = mixed_random();
  return (float)((long)((fVar4 + -0.5) * 67108864.0) + data->pink_running_sum) * data->pink_scalar;
}

Assistant:

float noise_pink(struct noise_segment_data *data){
  int64_t random;
  int64_t sum;

  data->pink_index = (data->pink_index + 1) & data->pink_index_mask;

  if(data->pink_index != 0) {
    int zeroes = 0;
    int n = data->pink_index;
    while((n & 1) == 0){
      n = n >> 1;
      zeroes++;
    }

    data->pink_running_sum -= data->pink_rows[zeroes];
    random = (mixed_random()-0.5)*67108864;
    data->pink_running_sum += random;
    data->pink_rows[zeroes] = random;
  }
  
  random = (mixed_random()-0.5)*67108864;
  sum = data->pink_running_sum + random;

  return data->pink_scalar * sum;
}